

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  _func_int **pp_Var1;
  cmGeneratorTarget *target_00;
  cmake *pcVar2;
  pointer pTVar3;
  string *psVar4;
  pointer pbVar5;
  pointer pcVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  undefined8 *puVar9;
  string *psVar10;
  ostream *poVar11;
  pointer pTVar12;
  string *c;
  undefined8 uVar13;
  cmExportBuildFileGenerator *pcVar14;
  pointer pbVar15;
  TargetExport *target;
  pointer pTVar16;
  byte bVar17;
  bool bVar18;
  string_view input;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar19;
  string expectedTargets;
  string sep;
  cmGeneratorTarget *te;
  cmCryptoHash hasher;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  string cxx_modules_name;
  undefined1 local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  ostream *local_268;
  pointer local_260;
  cmGeneratorTarget *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  pointer local_230;
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  cmExportBuildFileGenerator *local_200;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  string local_1e8;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  size_t local_180;
  ios_base local_138 [264];
  
  local_2a8._0_8_ = local_2a8 + 0x10;
  local_2a8._8_8_ = 0;
  local_2a8[0x10] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_1c8.
  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268 = os;
  GetTargets(this,&local_1c8);
  local_228 = local_1c8.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = local_1c8.
           super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1c8.
           super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((bool)bVar17) {
    pTVar12 = (pointer)0x0;
  }
  else {
    local_230 = (pointer)CONCAT71(local_230._1_7_,bVar17);
    local_1f0 = &(this->super_cmExportFileGenerator).Namespace;
    local_1f8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    local_200 = (cmExportBuildFileGenerator *)&this->Exports;
    local_260 = (pointer)0x0;
    pTVar16 = local_1c8.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_258 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,&pTVar16->Name);
      std::operator+(&local_250,&local_288,local_1f0);
      cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&local_220,local_258);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        uVar13 = local_250.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_250._M_string_length + local_220._8_8_) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_allocated_capacity != &local_210) {
          uVar13 = local_210._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_250._M_string_length + local_220._8_8_) goto LAB_0038c679;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_220,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
      }
      else {
LAB_0038c679:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_250,local_220._M_allocated_capacity)
        ;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      pp_Var1 = (_func_int **)(puVar9 + 2);
      if ((_func_int **)*puVar9 == pp_Var1) {
        local_1a8._16_8_ = *pp_Var1;
        aStack_190._M_allocated_capacity = puVar9[3];
      }
      else {
        local_1a8._16_8_ = *pp_Var1;
        local_1a8._0_8_ = (_func_int **)*puVar9;
      }
      local_1a8._8_8_ = puVar9[1];
      *puVar9 = pp_Var1;
      puVar9[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append(local_2a8,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_allocated_capacity != &local_210) {
        operator_delete((void *)local_220._M_allocated_capacity,local_210._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_288,0,(char *)local_288._M_string_length,0x7d535a);
      pVar19 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>(local_1f8,&local_258);
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(local_258);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                             psVar10->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" more than once.",0x11);
        pcVar2 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_250,(cmListFileBacktrace *)&local_220);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        pcVar14 = local_200;
        std::
        vector<cmExportBuildFileGenerator::TargetExportPrivate,std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>>
        ::emplace_back<cmGeneratorTarget*&,std::__cxx11::string_const&>
                  ((vector<cmExportBuildFileGenerator::TargetExportPrivate,std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>>
                    *)local_200,&local_258,&pTVar16->XcFrameworkLocation);
        TVar7 = GetExportTargetType(pcVar14,local_258);
        local_260 = (pointer)CONCAT71((int7)((ulong)local_260 >> 8),
                                      (byte)local_260 | TVar7 == INTERFACE_LIBRARY);
      }
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      pTVar16 = pTVar16 + 1;
      local_230 = (pointer)CONCAT71(local_230._1_7_,pTVar16 == local_228);
    } while (pTVar16 != local_228);
    pTVar12 = local_260;
    bVar17 = (byte)local_230;
  }
  if ((bVar17 & 1) != 0) {
    if (((ulong)pTVar12 & 1) != 0) {
      cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,0,0);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xc])
              (this,local_268,local_2a8);
  }
  std::
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._1_7_,local_288.field_2._M_local_buf[0]) + 1);
  }
  pcVar14 = (cmExportBuildFileGenerator *)local_2a8._0_8_;
  if ((cmExportBuildFileGenerator *)local_2a8._0_8_ !=
      (cmExportBuildFileGenerator *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
  }
  if ((bVar17 & 1) == 0) {
LAB_0038cfc9:
    bVar18 = false;
  }
  else {
    pTVar12 = (this->Exports).
              super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_230 = (this->Exports).
                super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    bVar18 = pTVar12 == local_230;
    if (!bVar18) {
      do {
        local_228 = (pointer)CONCAT71(local_228._1_7_,bVar18);
        target_00 = pTVar12->Target;
        local_260 = pTVar12;
        GetExportTargetType(pcVar14,target_00);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (this,local_268,target_00);
        cmTarget::AppendBuildInterfaceIncludes(target_00->Target);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = (_Base_ptr)0x0;
        aStack_190._M_allocated_capacity = (size_type)(local_1a8 + 8);
        local_180 = 0;
        local_2a8._0_8_ = local_2a8 + 0x10;
        aStack_190._8_8_ = aStack_190._M_allocated_capacity;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"INTERFACE_SOURCES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_PRECOMPILE_HEADERS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_AUTOMOC_MACRO_NAMES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a8,target_00,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        local_2a8._0_8_ = local_2a8 + 0x10;
        local_2a8._8_8_ = 0;
        local_2a8[0x10] = '\0';
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        bVar18 = cmExportFileGenerator::PopulateCxxModuleExportProperties
                           (&this->super_cmExportFileGenerator,target_00,
                            (ImportPropertyMap *)local_1a8,BuildInterface,&local_288,
                            (string *)local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._1_7_,local_288.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar18) {
          pcVar2 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2a8,
                              (cmListFileBacktrace *)&local_288);
LAB_0038cf4f:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length);
          }
          if ((cmExportBuildFileGenerator *)local_2a8._0_8_ !=
              (cmExportBuildFileGenerator *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_1a8);
          if (((ulong)local_228 & 1) == 0) goto LAB_0038cfc9;
          break;
        }
        bVar18 = cmExportFileGenerator::PopulateExportProperties
                           (&this->super_cmExportFileGenerator,target_00,
                            (ImportPropertyMap *)local_1a8,(string *)local_2a8);
        if (!bVar18) {
          pcVar2 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2a8,
                              (cmListFileBacktrace *)&local_288);
          goto LAB_0038cf4f;
        }
        PVar8 = cmPolicies::PolicyMap::Get(&target_00->PolicyMap,CMP0022);
        if ((PVar8 != WARN) &&
           (PVar8 = cmPolicies::PolicyMap::Get(&target_00->PolicyMap,CMP0022), PVar8 != OLD)) {
          cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                    (&this->super_cmExportFileGenerator,target_00,BuildInterface,
                     (ImportPropertyMap *)local_1a8);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,target_00,(ImportPropertyMap *)local_1a8);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                  (this,target_00,local_268);
        cmExportFileGenerator::GenerateTargetFileSets
                  (&this->super_cmExportFileGenerator,target_00,local_268,(cmTargetExport *)0x0);
        if ((cmExportBuildFileGenerator *)local_2a8._0_8_ !=
            (cmExportBuildFileGenerator *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
        }
        pcVar14 = (cmExportBuildFileGenerator *)local_1a8;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        pTVar12 = local_260 + 1;
        bVar18 = pTVar12 == local_230;
      } while (!bVar18);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    local_1a8._8_8_ = (pointer)0x0;
    local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
    if (this->ExportSet == (cmExportSet *)0x0) {
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_250,AlgoSHA3_512);
      pTVar16 = (this->Targets).
                super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (this->Targets).
               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pTVar16 != pTVar3) {
        do {
          input._M_str = (pTVar16->Name)._M_dataplus._M_p;
          input._M_len = (pTVar16->Name)._M_string_length;
          cmCryptoHash::Append((cmCryptoHash *)&local_250,input);
          pTVar16 = pTVar16 + 1;
        } while (pTVar16 != pTVar3);
      }
      cmCryptoHash::FinalizeHex_abi_cxx11_(&local_288,(cmCryptoHash *)&local_250);
      std::__cxx11::string::substr((ulong)local_2a8,(ulong)&local_288);
      std::__cxx11::string::operator=((string *)local_1a8,(string *)local_2a8);
      if ((cmExportBuildFileGenerator *)local_2a8._0_8_ !=
          (cmExportBuildFileGenerator *)(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._1_7_,local_288.field_2._M_local_buf[0]) + 1);
      }
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_250);
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_1a8);
    }
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,(string *)local_1a8,local_268);
    psVar4 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar10 = (this->super_cmExportFileGenerator).Configurations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar4;
        psVar10 = psVar10 + 1) {
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,local_268,psVar10);
    }
    pbVar15 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar15 != pbVar5) {
      do {
        pcVar6 = (pbVar15->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar6,pcVar6 + pbVar15->_M_string_length);
        GenerateImportCxxModuleConfigTargetInclusion(this,(string *)local_1a8,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
        }
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar5);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,local_268);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    bVar18 = true;
  }
  return bVar18;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<TargetExport> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (auto const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei.Name);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.emplace_back(te, tei.XcFrameworkLocation);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->SetRequiredCMakeVersion(3, 0, 0);
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Create all the imported targets.
  for (auto const& exp : this->Exports) {
    cmGeneratorTarget* gte = exp.Target;
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOMOC_MACRO_NAMES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateCxxModuleExportProperties(
          gte, properties, cmGeneratorExpression::BuildInterface, {},
          errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);

    this->GenerateTargetFileSets(gte, os);
  }

  std::string cxx_modules_name;
  if (this->ExportSet) {
    cxx_modules_name = this->ExportSet->GetName();
  } else {
    cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
    constexpr std::size_t HASH_TRUNCATION = 12;
    for (auto const& target : this->Targets) {
      hasher.Append(target.Name);
    }
    cxx_modules_name = hasher.FinalizeHex().substr(0, HASH_TRUNCATION);
  }

  this->GenerateCxxModuleInformation(cxx_modules_name, os);

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportCxxModuleConfigTargetInclusion(cxx_modules_name, c);
  }

  this->GenerateMissingTargetsCheckCode(os);

  return true;
}